

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mycontroller.cpp
# Opt level: O2

void Mycontroller::control(shared_ptr<Car> *car,SDL_Event *e)

{
  int iVar1;
  Car *pCVar2;
  string *psVar3;
  element_type *this;
  allocator<char> local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  iVar1 = (e->window).data2;
  switch(iVar1) {
  case 0x4000004f:
    pCVar2 = (car->super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"horizontal",&local_91);
    Car::setAxis(pCVar2,&local_90);
    psVar3 = &local_90;
    break;
  case 0x40000050:
    pCVar2 = (car->super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"horizontal",&local_91);
    Car::setAxis(pCVar2,&local_70);
    psVar3 = &local_70;
    goto LAB_00106545;
  case 0x40000051:
    pCVar2 = (car->super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"vertical",&local_91);
    Car::setAxis(pCVar2,&local_50);
    psVar3 = &local_50;
    break;
  case 0x40000052:
    pCVar2 = (car->super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"vertical",&local_91);
    Car::setAxis(pCVar2,&local_30);
    psVar3 = &local_30;
LAB_00106545:
    std::__cxx11::string::~string((string *)psVar3);
    this = (car->super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar1 = -1;
    goto LAB_0010654f;
  default:
    if ((iVar1 != 0x400000e0) && (iVar1 != 0x400000e4)) {
      return;
    }
    switchCars = !switchCars;
    return;
  }
  std::__cxx11::string::~string((string *)psVar3);
  this = (car->super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar1 = 1;
LAB_0010654f:
  Car::setDirection(this,iVar1);
  return;
}

Assistant:

void Mycontroller::control( std::shared_ptr<Car>  car,  SDL_Event& e){


      switch (e.key.keysym.sym) {
        case SDLK_UP:
          car->setAxis("vertical");
          car->setDirection(-1);
          break;

        case SDLK_DOWN:
          car->setAxis("vertical");
          car->setDirection(1);   
          break;

        case SDLK_LEFT:
          car->setAxis("horizontal");    
          car->setDirection(-1);
          break;

        case SDLK_RIGHT:
          car->setAxis("horizontal");
          car->setDirection(1);
        
        break;        
        
        case SDLK_RCTRL:
          Mycontroller::switchCars = !Mycontroller::switchCars;
        break;
                
        case SDLK_LCTRL:
          Mycontroller::switchCars = !Mycontroller::switchCars;
        break;
      }
    }